

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.h
# Opt level: O0

int UTF_uj16_cmpn(UTF_UC16 *uj16a,UTF_UC16 *uj16b,size_t len)

{
  bool bVar1;
  size_t local_28;
  size_t len_local;
  UTF_UC16 *uj16b_local;
  UTF_UC16 *uj16a_local;
  
  local_28 = len;
  len_local = (size_t)uj16b;
  uj16b_local = uj16a;
  while( true ) {
    bVar1 = false;
    if (*uj16b_local != L'\0') {
      bVar1 = *(short *)len_local != 0;
    }
    if (!bVar1) {
      if ((ushort)*uj16b_local < (ushort)*(UTF_UC16 *)len_local) {
        return -1;
      }
      if ((ushort)*(UTF_UC16 *)len_local < (ushort)*uj16b_local) {
        return 1;
      }
      return 0;
    }
    if (local_28 == 0) {
      return 0;
    }
    if ((ushort)*uj16b_local < (ushort)*(UTF_UC16 *)len_local) break;
    if ((ushort)*(UTF_UC16 *)len_local < (ushort)*uj16b_local) {
      return 1;
    }
    uj16b_local = uj16b_local + 1;
    len_local = len_local + 2;
    local_28 = local_28 - 1;
  }
  return -1;
}

Assistant:

static __inline int
UTF_uj16_cmpn(const UTF_UC16 *uj16a, const UTF_UC16 *uj16b, UTF_SIZE_T len)
{
    while (*uj16a && *uj16b)
    {
        if (len-- == 0) return 0;
        if (*uj16a < *uj16b) return -1;
        if (*uj16a > *uj16b) return 1;
        ++uj16a;
        ++uj16b;
    }
    if (*uj16a < *uj16b) return -1;
    if (*uj16a > *uj16b) return 1;
    return 0;
}